

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugPubTable::dump(DWARFDebugPubTable *this,raw_ostream *OS)

{
  bool bVar1;
  raw_ostream *prVar2;
  vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_> *this_00
  ;
  reference Vals;
  char **in_RCX;
  char *Str;
  char *local_130;
  format_object<const_char_*> local_128;
  char *local_110;
  format_object<const_char_*> local_108;
  undefined1 local_f0 [8];
  StringRef EntryKind;
  StringRef EntryLinkage;
  Entry *E;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
  *__range2;
  format_object<unsigned_long> local_80;
  format_object<unsigned_short> local_68;
  format_object<unsigned_int> local_50;
  reference local_38;
  Set *S;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_> *__range1;
  raw_ostream *OS_local;
  DWARFDebugPubTable *this_local;
  
  __end1 = std::
           vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
           begin(&this->Sets);
  S = (Set *)std::
             vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
             end(&this->Sets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::DWARFDebugPubTable::Set_*,_std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>_>
                                *)&S);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_llvm::DWARFDebugPubTable::Set_*,_std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>_>
               ::operator*(&__end1);
    prVar2 = raw_ostream::operator<<(OS,"length = ");
    format<unsigned_int>(&local_50,"0x%08x",&local_38->Length);
    raw_ostream::operator<<(prVar2,&local_50.super_format_object_base);
    prVar2 = raw_ostream::operator<<(OS," version = ");
    format<unsigned_short>(&local_68,"0x%04x",&local_38->Version);
    raw_ostream::operator<<(prVar2,&local_68.super_format_object_base);
    prVar2 = raw_ostream::operator<<(OS," unit_offset = ");
    format<unsigned_long>(&local_80,"0x%08lx",&local_38->Offset);
    raw_ostream::operator<<(prVar2,&local_80.super_format_object_base);
    prVar2 = raw_ostream::operator<<(OS," unit_size = ");
    format<unsigned_int>((format_object<unsigned_int> *)&__range2,"0x%08x",&local_38->Size);
    prVar2 = raw_ostream::operator<<(prVar2,(format_object_base *)&__range2);
    raw_ostream::operator<<(prVar2,'\n');
    in_RCX = (char **)CONCAT71((int7)((ulong)in_RCX >> 8),this->GnuStyle);
    Str = "Offset     Name\n";
    if ((this->GnuStyle & 1U) != 0) {
      Str = "Offset     Linkage  Kind     Name\n";
    }
    raw_ostream::operator<<(OS,Str);
    this_00 = &local_38->Entries;
    __end2 = std::
             vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
             ::begin(this_00);
    E = (Entry *)std::
                 vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                 ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_llvm::DWARFDebugPubTable::Entry_*,_std::vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>_>
                                  *)&E);
      if (!bVar1) break;
      Vals = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFDebugPubTable::Entry_*,_std::vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>_>
             ::operator*(&__end2);
      format<unsigned_long>
                ((format_object<unsigned_long> *)&EntryLinkage.Length,"0x%8.8lx ",&Vals->SecOffset);
      raw_ostream::operator<<(OS,(format_object_base *)&EntryLinkage.Length);
      if ((this->GnuStyle & 1U) != 0) {
        join_0x00000010_0x00000000_ = dwarf::GDBIndexEntryLinkageString((Vals->Descriptor).Linkage);
        _local_f0 = dwarf::GDBIndexEntryKindString((Vals->Descriptor).Kind);
        local_110 = StringRef::data((StringRef *)&EntryKind.Length);
        format<char_const*>(&local_108,(llvm *)"%-8s",(char *)&local_110,in_RCX);
        prVar2 = raw_ostream::operator<<(OS,&local_108.super_format_object_base);
        prVar2 = raw_ostream::operator<<(prVar2,' ');
        local_130 = StringRef::data((StringRef *)local_f0);
        format<char_const*>(&local_128,(llvm *)"%-8s",(char *)&local_130,in_RCX);
        prVar2 = raw_ostream::operator<<(prVar2,&local_128.super_format_object_base);
        raw_ostream::operator<<(prVar2,' ');
      }
      prVar2 = raw_ostream::operator<<(OS,'\"');
      in_RCX = (char **)(Vals->Name).Data;
      prVar2 = raw_ostream::operator<<(prVar2,Vals->Name);
      raw_ostream::operator<<(prVar2,"\"\n");
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFDebugPubTable::Entry_*,_std::vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFDebugPubTable::Set_*,_std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void DWARFDebugPubTable::dump(raw_ostream &OS) const {
  for (const Set &S : Sets) {
    OS << "length = " << format("0x%08x", S.Length);
    OS << " version = " << format("0x%04x", S.Version);
    OS << " unit_offset = " << format("0x%08" PRIx64, S.Offset);
    OS << " unit_size = " << format("0x%08x", S.Size) << '\n';
    OS << (GnuStyle ? "Offset     Linkage  Kind     Name\n"
                    : "Offset     Name\n");

    for (const Entry &E : S.Entries) {
      OS << format("0x%8.8" PRIx64 " ", E.SecOffset);
      if (GnuStyle) {
        StringRef EntryLinkage =
            GDBIndexEntryLinkageString(E.Descriptor.Linkage);
        StringRef EntryKind = dwarf::GDBIndexEntryKindString(E.Descriptor.Kind);
        OS << format("%-8s", EntryLinkage.data()) << ' '
           << format("%-8s", EntryKind.data()) << ' ';
      }
      OS << '\"' << E.Name << "\"\n";
    }
  }
}